

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O2

void __thiscall
so_5::impl::local_mbox_details::subscriber_adaptive_container_t::switch_storage_to_map
          (subscriber_adaptive_container_t *this)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  map_type new_storage;
  _Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  local_68;
  _Rb_tree<so_5::agent_t_*,_std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>,_std::_Select1st<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>,_so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,_std::allocator<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  local_48;
  
  local_48._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_48._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_right =
       local_48._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  for_each<__gnu_cxx::__normal_iterator<so_5::impl::local_mbox_details::subscriber_info_t*,std::vector<so_5::impl::local_mbox_details::subscriber_info_t,std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>>>,so_5::impl::local_mbox_details::subscriber_adaptive_container_t::switch_storage_to_map()::_lambda(so_5::impl::local_mbox_details::subscriber_info_t_const&)_1_>
            ((this->m_vector).
             super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_vector).
             super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
             ._M_impl.super__Vector_impl_data._M_finish,(map_type *)&local_48);
  std::
  _Rb_tree<so_5::agent_t_*,_std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>,_std::_Select1st<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>,_so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,_std::allocator<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  ::swap(&(this->m_map)._M_t,&local_48);
  psVar1 = (this->m_vector).
           super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_vector).
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68._M_impl.super__Vector_impl_data._M_end_of_storage;
  psVar2 = (this->m_vector).
           super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->m_vector).
           super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_vector).
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_start = local_68._M_impl.super__Vector_impl_data._M_start;
  (this->m_vector).
  super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_68._M_impl.super__Vector_impl_data._M_finish;
  this->m_storage = map;
  local_68._M_impl.super__Vector_impl_data._M_start = psVar2;
  local_68._M_impl.super__Vector_impl_data._M_finish = psVar3;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = psVar1;
  std::
  _Rb_tree<so_5::agent_t_*,_std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>,_std::_Select1st<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>,_so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,_std::allocator<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  ::~_Rb_tree(&local_48);
  std::
  _Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ::~_Vector_base(&local_68);
  return;
}

Assistant:

void
	switch_storage_to_map()
		{
			vector_type empty_vector;

			map_type new_storage;
			std::for_each( m_vector.begin(), m_vector.end(),
				[&new_storage]( const subscriber_info_t & info ) {
					new_storage.emplace( info.subscriber_pointer(), info );
				} );

			m_map.swap( new_storage );
			m_vector.swap( empty_vector );
			m_storage = storage_type::map;
		}